

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O0

void __thiscall
ezexample::setup_new_ezexample(ezexample *this,vw *this_vw,bool multiline,vw *this_vw_parser)

{
  vw *local_38;
  size_t i;
  vw *this_vw_parser_local;
  bool multiline_local;
  vw *this_vw_local;
  ezexample *this_local;
  
  this->vw_ref = this_vw;
  local_38 = this_vw_parser;
  if (this_vw_parser == (vw *)0x0) {
    local_38 = this_vw;
  }
  this->vw_par_ref = local_38;
  this->is_multiline = multiline;
  this->str[0] = '\0';
  this->str[1] = '\0';
  this->current_seed = 0;
  this->current_ns = '\0';
  this->quadratic_features_num = 0;
  this->quadratic_features_sqr = 0.0;
  for (i = 0; i < 0x100; i = i + 1) {
    this->ns_exists[i] = false;
  }
  this->example_changed_since_prediction = true;
  return;
}

Assistant:

void setup_new_ezexample(vw* this_vw, bool multiline, vw* this_vw_parser)
  {
    vw_ref = this_vw;
    vw_par_ref = (this_vw_parser == nullptr) ? this_vw : this_vw_parser;
    is_multiline = multiline;

    str[0] = 0;
    str[1] = 0;
    current_seed = 0;
    current_ns = 0;

    quadratic_features_num = 0;
    quadratic_features_sqr = 0.;

    for (size_t i = 0; i < 256; i++) ns_exists[i] = false;

    example_changed_since_prediction = true;
  }